

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<Eigen::Matrix<long,_1,1,0,_1,1>,void>
               (Matrix<long,__1,_1,_0,__1,_1> *container,ostream *os)

{
  bool bVar1;
  pointer_based_stl_iterator<const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *this;
  ostream *in_RSI;
  undefined8 in_RDI;
  long *elem;
  const_iterator __end0;
  const_iterator __begin0;
  Matrix<long,__1,_1,_0,__1,_1> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *in_stack_ffffffffffffffa8;
  pointer_based_stl_iterator<const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> local_48;
  pointer_based_stl_iterator<const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> local_38;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  ostream *local_10;
  undefined8 local_8;
  
  local_18 = 0x20;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RSI,'{');
  local_20 = 0;
  local_28 = local_8;
  local_38.m_ptr =
       (pointer)Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::begin
                          ((DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)0x14f153);
  local_48.m_ptr =
       (pointer)Eigen::DenseBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::end
                          ((DenseBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)0x14f162);
  do {
    bVar1 = Eigen::internal::pointer_based_stl_iterator<const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>
            ::operator!=(&local_38,&local_48);
    if (!bVar1) {
LAB_0014f1fa:
      if (local_20 != 0) {
        std::operator<<(local_10,' ');
      }
      std::operator<<(local_10,'}');
      return;
    }
    this = (pointer_based_stl_iterator<const_Eigen::Matrix<long,__1,_1,_0,__1,_1>_> *)
           Eigen::internal::pointer_based_stl_iterator<const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>
           ::operator*(&local_38);
    if ((local_20 != 0) && (std::operator<<(local_10,','), local_20 == 0x20)) {
      std::operator<<(local_10," ...");
      goto LAB_0014f1fa;
    }
    std::operator<<(local_10,' ');
    UniversalPrint<long>((long *)this,in_stack_ffffffffffffffa8);
    local_20 = local_20 + 1;
    Eigen::internal::pointer_based_stl_iterator<const_Eigen::Matrix<long,_-1,_1,_0,_-1,_1>_>::
    operator++(this);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }